

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O0

int __thiscall
cmCTestCoverageHandler::HandlePHPCoverage
          (cmCTestCoverageHandler *this,cmCTestCoverageHandlerContainer *cont)

{
  bool bVar1;
  char *d;
  size_type sVar2;
  string local_68;
  undefined1 local_48 [8];
  string coverageDir;
  cmParsePHPCoverage cov;
  cmCTestCoverageHandlerContainer *cont_local;
  cmCTestCoverageHandler *this_local;
  
  cmParsePHPCoverage::cmParsePHPCoverage
            ((cmParsePHPCoverage *)((long)&coverageDir.field_2 + 8),cont,
             (this->super_cmCTestGenericHandler).CTest);
  cmCTest::GetBinaryDir_abi_cxx11_(&local_68,(this->super_cmCTestGenericHandler).CTest);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                 &local_68,"/xdebugCoverage");
  std::__cxx11::string::~string((string *)&local_68);
  bVar1 = cmsys::SystemTools::FileIsDirectory((string *)local_48);
  if (bVar1) {
    d = (char *)std::__cxx11::string::c_str();
    cmParsePHPCoverage::ReadPHPCoverageDirectory
              ((cmParsePHPCoverage *)((long)&coverageDir.field_2 + 8),d);
  }
  sVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
          ::size(&cont->TotalCoverage);
  std::__cxx11::string::~string((string *)local_48);
  return (int)sVar2;
}

Assistant:

int cmCTestCoverageHandler::HandlePHPCoverage(
  cmCTestCoverageHandlerContainer* cont)
{
  cmParsePHPCoverage cov(*cont, this->CTest);
  std::string coverageDir = this->CTest->GetBinaryDir() + "/xdebugCoverage";
  if (cmSystemTools::FileIsDirectory(coverageDir)) {
    cov.ReadPHPCoverageDirectory(coverageDir.c_str());
  }
  return static_cast<int>(cont->TotalCoverage.size());
}